

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1_pack4.h
# Opt level: O0

void ncnn::conv1x1s2_sgemm_pack4_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  long in_RSI;
  long *in_RDI;
  __m128 _v;
  int j;
  int i;
  float *outptr;
  float *r0;
  int p;
  Mat bottom_blob_shrinked;
  int tailstep;
  int outh;
  int outw;
  int elempack;
  size_t elemsize;
  int channels;
  int w;
  Mat *m_1;
  Mat *m;
  undefined8 in_stack_fffffffffffffc50;
  size_t in_stack_fffffffffffffc58;
  undefined8 in_stack_fffffffffffffc60;
  undefined8 in_stack_fffffffffffffc68;
  Mat *in_stack_fffffffffffffc70;
  int local_348;
  int local_344;
  Option *in_stack_fffffffffffffcc0;
  Mat *in_stack_fffffffffffffcc8;
  Mat *in_stack_fffffffffffffcd0;
  undefined4 uVar1;
  Mat *in_stack_fffffffffffffcd8;
  Mat *in_stack_fffffffffffffce0;
  undefined8 *local_2f8;
  undefined8 local_2f0;
  undefined8 local_2e8;
  undefined8 local_2e0;
  undefined4 local_2d8;
  long local_2d0;
  undefined4 local_2c8;
  undefined4 local_2c4;
  undefined4 local_2c0;
  undefined4 local_2bc;
  undefined4 local_2b8;
  undefined8 local_2b0;
  undefined8 *local_2a8;
  int local_2a0;
  void *local_290;
  int *local_288;
  long local_280;
  undefined4 local_278;
  Mat *local_270;
  undefined4 local_268;
  int local_264;
  int local_260;
  undefined4 local_25c;
  undefined4 local_258;
  long local_250;
  int local_248;
  int local_244;
  int local_240;
  undefined4 local_23c;
  long local_238;
  int local_230;
  int local_22c;
  long *local_208;
  void **local_200;
  undefined8 *local_1f8;
  undefined1 *local_1e8;
  void **local_1d8;
  int local_1b8;
  undefined4 local_1b4;
  void **local_1b0;
  undefined1 *local_190;
  undefined8 *local_170;
  undefined1 local_165;
  int local_164;
  void **local_160;
  undefined1 *local_158;
  undefined1 *local_138;
  undefined8 *local_130;
  undefined1 local_125;
  int local_124;
  undefined8 *local_118;
  void *local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 *local_a0;
  undefined8 *local_98;
  long local_90;
  undefined4 local_84;
  long local_80;
  undefined8 *local_78;
  undefined4 local_6c;
  int local_68;
  int local_64;
  undefined8 *local_60;
  Mat *local_58;
  undefined4 local_4c;
  long local_48;
  undefined8 *local_40;
  undefined4 local_34;
  int local_30;
  int local_2c;
  undefined1 *local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_22c = *(int *)((long)in_RDI + 0x2c);
  local_230 = (int)in_RDI[7];
  local_238 = in_RDI[2];
  local_23c = (undefined4)in_RDI[3];
  local_240 = *(int *)(in_RSI + 0x2c);
  local_244 = *(int *)(in_RSI + 0x30);
  local_248 = (local_22c * 2 + local_240 * -2) * 4;
  local_200 = &local_290;
  local_290 = (void *)0x0;
  local_288 = (int *)0x0;
  local_280 = 0;
  local_278 = 0;
  local_270 = (Mat *)0x0;
  local_268 = 0;
  local_264 = 0;
  local_260 = 0;
  local_25c = 0;
  local_258 = 0;
  local_250 = 0;
  local_208 = in_RDI;
  Mat::create(in_stack_fffffffffffffc70,(int)((ulong)in_stack_fffffffffffffc68 >> 0x20),
              (int)in_stack_fffffffffffffc68,(int)((ulong)in_stack_fffffffffffffc60 >> 0x20),
              in_stack_fffffffffffffc58,(int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
              (Allocator *)in_stack_fffffffffffffcd0);
  for (local_2a0 = 0; local_2a0 < local_230; local_2a0 = local_2a0 + 1) {
    local_118 = &local_2f0;
    local_64 = *(int *)((long)local_208 + 0x2c);
    local_68 = (int)local_208[6];
    local_6c = *(undefined4 *)((long)local_208 + 0x34);
    local_78 = (undefined8 *)(*local_208 + local_208[8] * (long)local_2a0 * local_208[2]);
    local_80 = local_208[2];
    local_84 = (undefined4)local_208[3];
    local_90 = local_208[4];
    local_60 = &local_2f0;
    local_8 = (long)local_64 * (long)local_68 * local_80;
    local_130 = &local_2f0;
    local_1f8 = &local_2f0;
    local_c = 0x10;
    local_124 = local_2a0;
    local_125 = 1;
    local_2f0 = 0;
    local_2e0 = 0;
    local_2d8 = 0;
    local_2c8 = 0;
    local_2c4 = 0;
    local_2c0 = 0;
    local_2bc = 0;
    local_2b8 = 0;
    local_2b0 = 0;
    local_2e8 = 0;
    local_158 = &stack0xfffffffffffffcc0;
    local_160 = &local_290;
    local_164 = local_2a0;
    local_2c = local_264;
    local_30 = local_260;
    local_34 = local_25c;
    local_40 = (undefined8 *)((long)local_290 + local_250 * local_2a0 * local_280);
    local_48 = local_280;
    local_4c = local_278;
    local_58 = local_270;
    local_28 = &stack0xfffffffffffffcc0;
    local_18 = (long)local_264 * (long)local_260 * local_280;
    local_1c = 0x10;
    local_165 = 1;
    local_138 = &stack0xfffffffffffffcc0;
    local_1e8 = &stack0xfffffffffffffcc0;
    in_stack_fffffffffffffcc0 = (Option *)0x0;
    in_stack_fffffffffffffcd0 = (Mat *)0x0;
    uVar1 = 0;
    in_stack_fffffffffffffcc8 = (Mat *)0x0;
    local_2f8 = local_40;
    local_2a8 = local_78;
    for (local_344 = 0; local_344 < local_244; local_344 = local_344 + 1) {
      for (local_348 = 0; local_348 < local_240; local_348 = local_348 + 1) {
        local_98 = local_2a8;
        local_b8 = *local_2a8;
        uStack_b0 = local_2a8[1];
        local_a0 = local_2f8;
        *local_2f8 = local_b8;
        local_2f8[1] = uStack_b0;
        local_2a8 = local_2a8 + 4;
        local_2f8 = local_2f8 + 2;
      }
      local_2a8 = (undefined8 *)((long)local_2a8 + (long)local_248 * 4);
    }
    in_stack_fffffffffffffce0 = local_270;
    local_190 = local_1e8;
    local_170 = local_1f8;
    local_2d0 = local_90;
  }
  conv1x1s1_sgemm_pack4_sse
            (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
             in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
  local_1d8 = &local_290;
  if (local_288 != (int *)0x0) {
    local_1b4 = 0xffffffff;
    LOCK();
    local_1b8 = *local_288;
    *local_288 = *local_288 + -1;
    UNLOCK();
    if (local_1b8 == 1) {
      local_1b0 = local_1d8;
      if (local_270 == (Mat *)0x0) {
        local_c8 = local_290;
        if (local_290 != (void *)0x0) {
          free(local_290);
        }
      }
      else {
        (**(code **)((long)local_270->data + 0x18))(local_270,local_290);
      }
    }
  }
  return;
}

Assistant:

static void conv1x1s2_sgemm_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int tailstep = (w - 2 * outw + w) * 4;

    Mat bottom_blob_shrinked;
    bottom_blob_shrinked.create(outw, outh, channels, elemsize, elempack, opt.workspace_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < channels; p++)
    {
        const float* r0 = bottom_blob.channel(p);
        float* outptr = bottom_blob_shrinked.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                __m128 _v = _mm_load_ps(r0);
                _mm_store_ps(outptr, _v);

                r0 += 8;
                outptr += 4;
            }

            r0 += tailstep;
        }
    }

    conv1x1s1_sgemm_pack4_sse(bottom_blob_shrinked, top_blob, kernel, _bias, opt);
}